

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O2

_Bool find_affine(Correspondence *points,int *indices,int num_indices,double *params)

{
  double b;
  double dVar1;
  double dVar2;
  _Bool _Var3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double local_158;
  double local_150;
  double dStack_148;
  double local_140;
  double local_138;
  double dStack_130;
  double x [2] [3];
  double y [2] [3];
  double mat [2] [9];
  
  mat[0][0] = 0.0;
  mat[0][1] = 0.0;
  mat[0][2] = 0.0;
  mat[0][3] = 0.0;
  mat[0][8] = 0.0;
  mat[0][4] = 0.0;
  mat[0][5] = 0.0;
  mat[0][6] = 0.0;
  mat[0][7] = 0.0;
  y[0][0] = 0.0;
  y[0][1] = 0.0;
  y[0][2] = 0.0;
  mat[1][0] = 0.0;
  mat[1][1] = 0.0;
  mat[1][2] = 0.0;
  mat[1][3] = 0.0;
  mat[1][8] = 0.0;
  mat[1][4] = 0.0;
  mat[1][5] = 0.0;
  y[1][2] = 0.0;
  mat[1][6] = 0.0;
  mat[1][7] = 0.0;
  y[1][0] = 0.0;
  y[1][1] = 0.0;
  uVar6 = 0;
  uVar5 = (ulong)(uint)num_indices;
  if (num_indices < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    iVar4 = indices[uVar6];
    b = points[iVar4].ry;
    local_158 = 1.0;
    dVar1 = points[iVar4].x;
    dVar2 = points[iVar4].y;
    local_150 = dVar1;
    dStack_148 = dVar2;
    least_squares_accumulate(mat[0],y[0],&local_158,points[iVar4].rx,3);
    local_140 = 1.0;
    local_138 = dVar1;
    dStack_130 = dVar2;
    least_squares_accumulate(mat[1],y[1],&local_140,b,3);
  }
  iVar4 = least_squares_solve(mat[0],y[0],x[0],3);
  if ((iVar4 == 0) || (iVar4 = least_squares_solve(mat[1],y[1],x[1],3), iVar4 == 0)) {
    _Var3 = false;
  }
  else {
    *params = x[0][0];
    params[1] = x[1][0];
    params[2] = x[0][1];
    params[3] = x[0][2];
    params[4] = x[1][1];
    params[5] = x[1][2];
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

static bool find_affine(const Correspondence *points, const int *indices,
                        int num_indices, double *params) {
  // Note: The least squares problem for affine models is 6-dimensional,
  // but it splits into two independent 3-dimensional subproblems.
  // Solving these two subproblems separately and recombining at the end
  // results in less total computation than solving the 6-dimensional
  // problem directly.
  //
  // The two subproblems correspond to all the parameters which contribute
  // to the x output of the model, and all the parameters which contribute
  // to the y output, respectively.

  const int n = 3;       // Size of each least-squares problem
  double mat[2][3 * 3];  // Accumulator for A'A
  double y[2][3];        // Accumulator for A'b
  double x[2][3];        // Output vector
  double a[2][3];        // Single row of A
  double b[2];           // Single element of b

  least_squares_init(mat[0], y[0], n);
  least_squares_init(mat[1], y[1], n);
  for (int i = 0; i < num_indices; ++i) {
    int index = indices[i];
    const double sx = points[index].x;
    const double sy = points[index].y;
    const double dx = points[index].rx;
    const double dy = points[index].ry;

    a[0][0] = 1;
    a[0][1] = sx;
    a[0][2] = sy;
    b[0] = dx;
    least_squares_accumulate(mat[0], y[0], a[0], b[0], n);

    a[1][0] = 1;
    a[1][1] = sx;
    a[1][2] = sy;
    b[1] = dy;
    least_squares_accumulate(mat[1], y[1], a[1], b[1], n);
  }

  if (!least_squares_solve(mat[0], y[0], x[0], n)) {
    return false;
  }
  if (!least_squares_solve(mat[1], y[1], x[1], n)) {
    return false;
  }

  // Rearrange least squares result to form output model
  params[0] = x[0][0];
  params[1] = x[1][0];
  params[2] = x[0][1];
  params[3] = x[0][2];
  params[4] = x[1][1];
  params[5] = x[1][2];

  return true;
}